

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O2

int __thiscall branch_and_reduce_algorithm::cycleLowerBound(branch_and_reduce_algorithm *this)

{
  ulong uVar1;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *__x;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pvVar7;
  int *piVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int i;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int *piVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  int local_8c;
  int local_80;
  int local_7c;
  
  iVar10 = this->crt;
  piVar2 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar14 = 0; uVar11 = (ulong)this->n, lVar14 < (long)uVar11; lVar14 = lVar14 + 1) {
    piVar2[lVar14] = -1;
  }
  this_00 = &this->level;
  __x = &this->modTmp;
  uVar19 = 0;
  do {
    if ((long)(int)uVar11 <= (long)uVar19) {
      if ((int)uVar11 * 2 !=
          (int)((ulong)((long)(this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2)) {
        std::_Vector_base<int,_std::allocator<int>_>::_Vector_impl_data::_M_swap_data
                  ((_Vector_impl_data *)this_00,(_Vector_impl_data *)__x);
      }
      return iVar10;
    }
    piVar2 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    if ((piVar2[uVar19] < 0) &&
       (piVar3 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start, piVar3[uVar19] < 0)) {
      piVar4 = (this->out).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar20 = 0;
      uVar11 = uVar19 & 0xffffffff;
      do {
        iVar18 = (int)uVar11;
        if (-1 < piVar3[iVar18]) {
          __assert_fail("id[v] < 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                        ,0x1c1,"int branch_and_reduce_algorithm::cycleLowerBound()");
        }
        piVar3[iVar18] = (int)uVar19;
        uVar21 = piVar4[iVar18];
        uVar11 = (ulong)uVar21;
        piVar5[(int)uVar21] = (int)uVar20;
        piVar6[uVar20] = uVar21;
        uVar20 = uVar20 + 1;
      } while (uVar19 != uVar11);
      pvVar7 = (this->adj).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = 0;
      do {
        if (uVar20 == uVar11) {
          iVar10 = iVar10 + (int)uVar20 + -1;
          goto LAB_00108d3f;
        }
        iVar18 = piVar6[uVar11];
        iVar16 = 0;
        for (piVar17 = pvVar7[iVar18].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
            piVar17 !=
            *(pointer *)
             ((long)&pvVar7[iVar18].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data + 8); piVar17 = piVar17 + 1) {
          if (piVar2[*piVar17] < 0) {
            iVar16 = (uint)(piVar3[*piVar17] == piVar3[iVar18]) + iVar16;
          }
        }
        uVar11 = uVar11 + 1;
      } while (iVar16 + 1 == (int)uVar20);
      while (iVar18 = (int)uVar20, 5 < iVar18) {
        local_7c = 0;
        uVar11 = 0;
        local_8c = iVar18;
        local_80 = iVar18;
        while (uVar11 != (uVar20 & 0xffffffff)) {
          fast_set::clear(&this->used);
          piVar2 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar16 = piVar2[uVar11];
          pvVar7 = (this->adj).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar3 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = *(pointer *)
                    ((long)&pvVar7[iVar16].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data + 8);
          piVar4 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar5 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          for (piVar17 = pvVar7[iVar16].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start; piVar17 != piVar8; piVar17 = piVar17 + 1)
          {
            iVar15 = *piVar17;
            if ((piVar3[iVar15] < 0) && (piVar4[iVar15] == piVar4[iVar16])) {
              piVar5[iVar15] = (this->used).uid;
            }
          }
          uVar1 = uVar11 + 1;
          uVar9 = (uVar1 & 0xffffffff) % (uVar20 & 0xffffffff);
          iVar16 = piVar2[uVar9];
          piVar3 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar15 = (int)uVar11;
          for (piVar17 = pvVar7[iVar16].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start; uVar11 = uVar1,
              piVar17 !=
              *(pointer *)
               ((long)&pvVar7[iVar16].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data + 8); piVar17 = piVar17 + 1) {
            iVar13 = *piVar17;
            if (((this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar13] < 0) && (piVar3[iVar13] == piVar3[iVar16])
               ) {
              iVar13 = (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar13];
              iVar12 = (iVar13 + 1) % iVar18;
              if ((this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[piVar2[iVar12]] == (this->used).uid) {
                uVar11 = (long)(iVar13 + (iVar18 - iVar15)) % (long)iVar18;
                iVar13 = (int)uVar11;
                if ((iVar13 < local_8c) && ((uVar11 & 1) != 0)) {
                  local_7c = (int)uVar9;
                  local_8c = iVar13;
                  local_80 = iVar12;
                }
              }
            }
          }
        }
        if (iVar18 == local_8c) break;
        piVar2 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3 = (__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar21 = 0;
        uVar20 = 0;
        for (iVar16 = local_80; iVar16 != local_7c; iVar16 = (iVar16 + 1) % iVar18) {
          piVar3[uVar20] = piVar2[iVar16];
          uVar20 = uVar20 + 1;
          uVar21 = uVar21 + 1;
        }
        piVar2 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (; local_7c != local_80; local_7c = (local_7c + 1) % iVar18) {
          piVar3[piVar2[local_7c]] = this->n;
        }
        std::_Vector_base<int,_std::allocator<int>_>::_Vector_impl_data::_M_swap_data
                  ((_Vector_impl_data *)this_00,(_Vector_impl_data *)__x);
        if (iVar18 - local_8c != (int)uVar20) {
          __assert_fail("size == p",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                        ,0x206,"int branch_and_reduce_algorithm::cycleLowerBound()");
        }
        if (local_8c < 2) {
          __assert_fail("minSize > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                        ,0x207,"int branch_and_reduce_algorithm::cycleLowerBound()");
        }
        piVar2 = (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((int)uVar21 < 1) {
          uVar21 = 0;
        }
        for (uVar11 = 0; uVar21 != uVar11; uVar11 = uVar11 + 1) {
          piVar2[piVar3[uVar11]] = (int)uVar11;
        }
        iVar10 = iVar10 + (local_8c + 1U >> 1);
      }
      if (iVar18 < 2) {
        __assert_fail("size > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                      ,0x20c,"int branch_and_reduce_algorithm::cycleLowerBound()");
      }
      iVar10 = (iVar18 + 1U >> 1) + iVar10;
    }
LAB_00108d3f:
    uVar19 = uVar19 + 1;
    uVar11 = (ulong)(uint)this->n;
  } while( true );
}

Assistant:

int branch_and_reduce_algorithm::cycleLowerBound()
{
    int lb = crt;
    std::vector<int> &id = iter;
    for (int i = 0; i < n; i++)
        id[i] = -1;
    std::vector<int> &pos = que;
    std::vector<int> &S = level;
    std::vector<int> &S2 = modTmp;
    for (int i = 0; i < n; i++)
        if (x[i] < 0 && id[i] < 0)
        {
            int v = i;
            int size = 0;
            do
            {
                assert(id[v] < 0);
                id[v] = i;
                v = out[v];
                pos[v] = size;
                S[size++] = v;
            } while (v != i);
            bool clique = true;
            for (int j = 0; j < size; j++)
            {
                v = S[j];
                int num = 0;
                for (int u : adj[v])
                    if (x[u] < 0 && id[u] == id[v])
                        num++;
                if (num != size - 1)
                {
                    clique = false;
                    break;
                }
            }
            if (clique)
            {
                lb += size - 1;
            }
            else
            {
                while (size >= 6)
                {
                    int minSize = size, s = 0, t = size;
                    for (int j = 0; j < size; j++)
                    {
                        used.clear();
                        v = S[j];
                        for (int u : adj[v])
                            if (x[u] < 0 && id[u] == id[v])
                            {
                                used.add(u);
                            }
                        v = S[(j + 1) % size];
                        for (int u : adj[v])
                            if (x[u] < 0 && id[u] == id[v])
                            {
                                if (used.get(S[(pos[u] + 1) % size]))
                                {
                                    int size2 = (pos[u] - j + size) % size;
                                    if (minSize > size2 && size2 % 2 != 0)
                                    {
                                        minSize = size2;
                                        s = (j + 1) % size;
                                        t = (pos[u] + 1) % size;
                                    }
                                }
                            }
                    }
                    if (minSize == size)
                        break;
                    int p = 0;
                    for (int j = t; j != s; j = (j + 1) % size)
                    {
                        S2[p++] = S[j];
                    }
                    for (int j = s; j != t; j = (j + 1) % size)
                    {
                        id[S[j]] = n;
                    }

                    S.swap(S2);

                    size -= minSize;
                    assert(size == p);
                    assert(minSize > 1);
                    lb += (minSize + 1) / 2;
                    for (int j = 0; j < size; j++)
                        pos[S[j]] = j;
                }
                assert(size > 1);
                lb += (size + 1) / 2;
            }
        }

    if (static_cast<int>(level.size()) != n * 2)
    {
        level.swap(modTmp);
    }
    return lb;
}